

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGParseInclude(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlNodePtr pxVar2;
  int local_34;
  int tmp;
  int ret;
  xmlNodePtr root;
  xmlRelaxNGIncludePtr_conflict incl;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  local_34 = 0;
  if (node->psvi == (void *)0x0) {
    xmlRngPErr(ctxt,node,0x412,"Include node has no data\n",(xmlChar *)0x0,(xmlChar *)0x0);
    ctxt_local._4_4_ = -1;
  }
  else {
    pxVar2 = xmlDocGetRootElement(*(xmlDoc **)((long)node->psvi + 0x10));
    if (pxVar2 == (xmlNodePtr)0x0) {
      xmlRngPErr(ctxt,node,0x3fe,"Include document is empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt_local._4_4_ = -1;
    }
    else {
      iVar1 = xmlStrEqual(pxVar2->name,"grammar");
      if (iVar1 == 0) {
        xmlRngPErr(ctxt,node,0x40e,"Include document root is not a grammar\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
        ctxt_local._4_4_ = -1;
      }
      else {
        if ((pxVar2->children != (_xmlNode *)0x0) &&
           (iVar1 = xmlRelaxNGParseGrammarContent(ctxt,pxVar2->children), iVar1 != 0)) {
          local_34 = -1;
        }
        if ((node->children != (_xmlNode *)0x0) &&
           (iVar1 = xmlRelaxNGParseGrammarContent(ctxt,node->children), iVar1 != 0)) {
          local_34 = -1;
        }
        ctxt_local._4_4_ = local_34;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGParseInclude(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGIncludePtr incl;
    xmlNodePtr root;
    int ret = 0, tmp;

    incl = node->psvi;
    if (incl == NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_INCLUDE_EMPTY,
                   "Include node has no data\n", NULL, NULL);
        return (-1);
    }
    root = xmlDocGetRootElement(incl->doc);
    if (root == NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_EMPTY, "Include document is empty\n",
                   NULL, NULL);
        return (-1);
    }
    if (!xmlStrEqual(root->name, BAD_CAST "grammar")) {
        xmlRngPErr(ctxt, node, XML_RNGP_GRAMMAR_MISSING,
                   "Include document root is not a grammar\n", NULL, NULL);
        return (-1);
    }

    /*
     * Merge the definition from both the include and the internal list
     */
    if (root->children != NULL) {
        tmp = xmlRelaxNGParseGrammarContent(ctxt, root->children);
        if (tmp != 0)
            ret = -1;
    }
    if (node->children != NULL) {
        tmp = xmlRelaxNGParseGrammarContent(ctxt, node->children);
        if (tmp != 0)
            ret = -1;
    }
    return (ret);
}